

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSparsityPatternLearner.h
# Opt level: O2

void __thiscall
chrono::ChSparsityPatternLearner::ChSparsityPatternLearner
          (ChSparsityPatternLearner *this,int nrows,int ncols)

{
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix
            (&this->super_SparseMatrix<double,_1,_int>,(long)nrows,(long)ncols);
  (this->super_SparseMatrix<double,_1,_int>)._vptr_SparseMatrix =
       (_func_int **)&PTR_SetElement_011858b8;
  (this->innerVectors).
  super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->innerVectors).
  super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->innerVectors).
  super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->innerVectors_size).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->innerVectors).
           super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)
   ((long)&(this->innerVectors_size).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 1) = 0;
  *(undefined8 *)
   ((long)&(this->innerVectors_size).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->innerVectors_size).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  std::
  vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::resize(&this->innerVectors,(this->super_SparseMatrix<double,_1,_int>).m_outerSize);
  return;
}

Assistant:

ChSparsityPatternLearner(int nrows, int ncols) : ChSparseMatrix(nrows, ncols), processed(false) {
        // RowMajor: outerSize == nrows
        // ColMajor: outerSize == ncols
        innerVectors.resize(outerSize());
    }